

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bandpre.c
# Opt level: O2

int CVBandPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                   void *bp_data)

{
  CVodeMem cv_mem;
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  sunrealtype *psVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long j;
  long lVar17;
  long lVar18;
  char *msgfmt;
  long lVar19;
  long lVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double local_c0;
  long local_a8;
  double local_a0;
  
  cv_mem = *(CVodeMem *)((long)bp_data + 0x48);
  if (jok == 0) {
    *jcurPtr = 1;
    iVar6 = SUNMatZero(*(undefined8 *)((long)bp_data + 0x18));
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x181;
      goto LAB_0010ff01;
    }
    if (iVar6 != 0) {
      return 1;
    }
    uVar1 = *(undefined8 *)((long)bp_data + 0x30);
    uVar2 = *(undefined8 *)((long)bp_data + 0x38);
    lVar3 = *(long *)((long)bp_data + 0x48);
    lVar7 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 200));
    lVar8 = N_VGetArrayPointer(fy);
    lVar9 = N_VGetArrayPointer(uVar1);
    lVar10 = N_VGetArrayPointer(y);
    lVar11 = N_VGetArrayPointer(uVar2);
    if (*(int *)(lVar3 + 0x58) == 0) {
      local_a8 = 0;
    }
    else {
      local_a8 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 0x108));
    }
    N_VScale(0x3ff0000000000000,y,uVar2);
    dVar21 = *(double *)(lVar3 + 8);
    local_c0 = 0.0;
    if (0.0 < dVar21) {
      if (dVar21 < 0.0) {
        local_c0 = sqrt(dVar21);
      }
      else {
        local_c0 = SQRT(dVar21);
      }
    }
    dVar21 = (double)N_VWrmsNorm(fy,*(undefined8 *)(lVar3 + 200));
    lVar14 = *bp_data;
    local_a0 = 1.0;
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      local_a0 = dVar21 * (double)lVar14 *
                          ABS(*(double *)(lVar3 + 0x140)) * 1000.0 * *(double *)(lVar3 + 8);
    }
    lVar4 = *(long *)((long)bp_data + 8);
    lVar5 = *(long *)((long)bp_data + 0x10);
    lVar16 = lVar4 + lVar5 + 1;
    lVar17 = lVar14;
    if (lVar16 < lVar14) {
      lVar17 = lVar16;
    }
    if (lVar17 < 1) {
      lVar17 = 0;
    }
    lVar19 = 0;
    for (lVar20 = 1; lVar20 != lVar17 + 1; lVar20 = lVar20 + 1) {
      j = lVar20 + -1;
      for (lVar12 = j; lVar12 < lVar14; lVar12 = lVar12 + lVar16) {
        dVar21 = *(double *)(lVar10 + lVar12 * 8);
        dVar22 = local_a0 / *(double *)(lVar7 + lVar12 * 8);
        dVar24 = ABS(dVar21) * local_c0;
        if (dVar24 <= dVar22) {
          dVar24 = dVar22;
        }
        if (*(int *)(lVar3 + 0x58) != 0) {
          dVar22 = *(double *)(local_a8 + lVar12 * 8);
          dVar23 = ABS(dVar22);
          dVar21 = dVar21 + dVar24;
          if ((dVar23 != 1.0) || (NAN(dVar23))) {
            if ((dVar23 == 2.0) && ((!NAN(dVar23) && (dVar21 * dVar22 <= 0.0)))) goto LAB_001100d9;
          }
          else if (dVar21 * dVar22 < 0.0) {
LAB_001100d9:
            dVar24 = -dVar24;
          }
        }
        *(double *)(lVar11 + lVar12 * 8) = dVar24 + *(double *)(lVar11 + lVar12 * 8);
      }
      iVar6 = (**(code **)(lVar3 + 0x10))(uVar2,uVar1,*(undefined8 *)(lVar3 + 0x18));
      *(long *)((long)bp_data + 0x40) = *(long *)((long)bp_data + 0x40) + 1;
      if (iVar6 != 0) {
        if (-1 < iVar6) {
          return 1;
        }
        msgfmt = "The right-hand side routine failed in an unrecoverable manner.";
        iVar6 = 0x189;
        goto LAB_0010ff01;
      }
      lVar14 = *bp_data;
      lVar12 = lVar19;
      for (; j < lVar14; j = j + lVar16) {
        dVar21 = *(double *)(lVar10 + j * 8);
        *(double *)(lVar11 + j * 8) = dVar21;
        psVar13 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bp_data + 0x18),j);
        dVar22 = local_a0 / *(double *)(lVar7 + j * 8);
        dVar24 = ABS(*(double *)(lVar10 + j * 8)) * local_c0;
        if (dVar24 <= dVar22) {
          dVar24 = dVar22;
        }
        if (*(int *)(lVar3 + 0x58) != 0) {
          dVar22 = *(double *)(local_a8 + j * 8);
          dVar23 = ABS(dVar22);
          dVar21 = dVar21 + dVar24;
          if ((dVar23 != 1.0) || (NAN(dVar23))) {
            if ((dVar23 == 2.0) && ((!NAN(dVar23) && (dVar21 * dVar22 <= 0.0)))) goto LAB_00110236;
          }
          else if (dVar21 * dVar22 < 0.0) {
LAB_00110236:
            dVar24 = -dVar24;
          }
        }
        lVar15 = j - *(long *)((long)bp_data + 0x10);
        if (lVar15 < 1) {
          lVar15 = 0;
        }
        lVar18 = *(long *)((long)bp_data + 8) + j;
        lVar14 = *bp_data;
        if (lVar14 + -1 <= lVar18) {
          lVar18 = lVar14 + -1;
        }
        for (; lVar15 <= lVar18; lVar15 = lVar15 + 1) {
          *(double *)((long)psVar13 + lVar15 * 8 + lVar12) =
               (*(double *)(lVar9 + lVar15 * 8) - *(double *)(lVar8 + lVar15 * 8)) * (1.0 / dVar24);
        }
        lVar12 = lVar12 + ~(lVar4 + lVar5) * 8;
      }
      lVar19 = lVar19 + -8;
    }
    iVar6 = SUNMatCopy(t,*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20)
                      );
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x192;
      goto LAB_0010ff01;
    }
  }
  else {
    *jcurPtr = 0;
    iVar6 = SUNMatCopy(*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20));
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x175;
      goto LAB_0010ff01;
    }
  }
  if (iVar6 != 0) {
    return 1;
  }
  iVar6 = SUNMatScaleAddI(-gamma,*(undefined8 *)((long)bp_data + 0x20));
  if (iVar6 == 0) {
    iVar6 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bp_data + 0x28),
                                *(SUNMatrix *)((long)bp_data + 0x20));
    return iVar6;
  }
  msgfmt = "An error arose from a SUNBandMatrix routine.";
  iVar6 = 0x19c;
LAB_0010ff01:
  cvProcessError(cv_mem,-1,iVar6,"CVBandPrecSetup",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                 ,msgfmt);
  return -1;
}

Assistant:

static int CVBandPrecSetup(sunrealtype t, N_Vector y, N_Vector fy,
                           sunbooleantype jok, sunbooleantype* jcurPtr,
                           sunrealtype gamma, void* bp_data)
{
  CVBandPrecData pdata;
  CVodeMem cv_mem;
  int retval;

  /* Assume matrix and lpivots have already been allocated. */
  pdata  = (CVBandPrecData)bp_data;
  cv_mem = (CVodeMem)pdata->cvode_mem;

  if (jok)
  {
    /* If jok = SUNTRUE, use saved copy of J. */
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }
  else
  {
    /* If jok = SUNFALSE, call CVBandPDQJac for new J value. */
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = CVBandPDQJac(pdata, t, y, fy, pdata->tmp1, pdata->tmp2);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBP_RHSFUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add identity to get savedP = I - gamma*J. */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}